

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateInfo<unsigned_char>(UpdateInfo *current,uchar *result_data)

{
  void *__src;
  idx_t i;
  ulong uVar1;
  uint uVar2;
  
  uVar2 = current->N;
  __src = (void *)((long)&current[1].segment + (ulong)current->max * 4);
  if (uVar2 == 0x800) {
    switchD_016b45db::default(result_data,__src,0x800);
    return;
  }
  for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 1) {
    result_data[*(uint *)((long)&current[1].segment + uVar1 * 4)] = *(uchar *)((long)__src + uVar1);
    uVar2 = current->N;
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}